

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

Curl_dns_entry * fetch_addr(connectdata *conn,char *hostname,int port)

{
  size_t sVar1;
  Curl_dns_entry *pCVar2;
  size_t in_RCX;
  hostcache_prune_data *data;
  Curl_dns_entry *c;
  hostcache_prune_data user;
  char entry_id [262];
  long local_140;
  char local_138 [272];
  
  create_hostcache_id(hostname,port,local_138,in_RCX);
  sVar1 = strlen(local_138);
  pCVar2 = (Curl_dns_entry *)
           Curl_hash_pick(*(curl_hash **)((conn->cnnct).socksreq + 0xa4),local_138,sVar1 + 1);
  if (pCVar2 == (Curl_dns_entry *)0x0) {
    if (((ulong)conn[1].easyq.tail & 4) != 0) {
      create_hostcache_id("*",port,local_138,in_RCX);
      sVar1 = strlen(local_138);
      pCVar2 = (Curl_dns_entry *)
               Curl_hash_pick(*(curl_hash **)((conn->cnnct).socksreq + 0xa4),local_138,sVar1 + 1);
      if (pCVar2 != (Curl_dns_entry *)0x0) goto LAB_0010b29b;
    }
    pCVar2 = (Curl_dns_entry *)0x0;
  }
  else {
LAB_0010b29b:
    if (*(long *)conn[1].ip_addr_str != -1) {
      time(&local_140);
      if ((pCVar2->timestamp != 0) &&
         (*(long *)conn[1].ip_addr_str <= local_140 - pCVar2->timestamp)) {
        pCVar2 = (Curl_dns_entry *)0x0;
        Curl_infof((Curl_easy *)conn,"Hostname in DNS cache was stale, zapped\n");
        Curl_hash_delete(*(curl_hash **)((conn->cnnct).socksreq + 0xa4),local_138,sVar1 + 1);
      }
    }
  }
  return pCVar2;
}

Assistant:

static struct Curl_dns_entry *
fetch_addr(struct connectdata *conn,
                const char *hostname,
                int port)
{
  struct Curl_dns_entry *dns = NULL;
  size_t entry_len;
  struct Curl_easy *data = conn->data;
  char entry_id[MAX_HOSTCACHE_LEN];

  /* Create an entry id, based upon the hostname and port */
  create_hostcache_id(hostname, port, entry_id, sizeof(entry_id));
  entry_len = strlen(entry_id);

  /* See if its already in our dns cache */
  dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);

  /* No entry found in cache, check if we might have a wildcard entry */
  if(!dns && data->change.wildcard_resolve) {
    create_hostcache_id("*", port, entry_id, sizeof(entry_id));
    entry_len = strlen(entry_id);

    /* See if it's already in our dns cache */
    dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);
  }

  if(dns && (data->set.dns_cache_timeout != -1)) {
    /* See whether the returned entry is stale. Done before we release lock */
    struct hostcache_prune_data user;

    time(&user.now);
    user.cache_timeout = data->set.dns_cache_timeout;

    if(hostcache_timestamp_remove(&user, dns)) {
      infof(data, "Hostname in DNS cache was stale, zapped\n");
      dns = NULL; /* the memory deallocation is being handled by the hash */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);
    }
  }

  return dns;
}